

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTarget.cpp
# Opt level: O0

void __thiscall
Outputs::Display::OpenGL::TextureTarget::draw
          (TextureTarget *this,float aspect_ratio,float colour_threshold)

{
  bool bVar1;
  GLint GVar2;
  uint uVar3;
  pointer pSVar4;
  ostream *poVar5;
  socklen_t in_ECX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int in_ESI;
  int __fd;
  unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
  *puVar6;
  string *name;
  GLenum error_13;
  GLenum error_12;
  GLenum error_11;
  GLenum error_10;
  GLenum error_9;
  float aspect_ratio_ratio;
  float internal_aspect_ratio;
  float buffer [16];
  allocator<char> local_109;
  string local_108;
  uint local_e8;
  allocator<char> local_e1;
  GLenum error_8;
  GLint local_bc;
  uint local_b8;
  GLint texIDUniform;
  GLenum error_7;
  GLenum error_6;
  GLsizei vertex_stride;
  GLenum error_5;
  GLenum error_4;
  GLint local_80;
  GLint tex_coord_attribute;
  allocator<char> local_69;
  string local_68;
  GLint local_44;
  uint local_40;
  GLint position_attribute;
  GLenum error_3;
  GLenum error_2;
  GLenum error_1;
  GLenum error;
  char *local_28;
  char *fragment_shader;
  char *vertex_shader;
  float colour_threshold_local;
  float aspect_ratio_local;
  TextureTarget *this_local;
  
  vertex_shader._0_4_ = colour_threshold;
  vertex_shader._4_4_ = aspect_ratio;
  _colour_threshold_local = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pixel_shader_);
  if (!bVar1) {
    fragment_shader =
         "#version 150\nin vec2 texCoord;in vec2 position;out vec2 texCoordVarying;void main(void){texCoordVarying = texCoord;gl_Position = vec4(position, 0.0, 1.0);}"
    ;
    local_28 = 
    "#version 150\nin vec2 texCoordVarying;uniform sampler2D texID;uniform float threshold;out vec4 fragColour;void main(void){fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);}"
    ;
    std::make_unique<Outputs::Display::OpenGL::Shader,char_const*&,char_const*&>
              ((char **)&error_1,&fragment_shader);
    puVar6 = (unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
              *)&error_1;
    std::
    unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
    ::operator=(&this->pixel_shader_,puVar6);
    __fd = (int)puVar6;
    std::
    unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
    ::~unique_ptr((unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
                   *)&error_1);
    pSVar4 = std::
             unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ::operator->(&this->pixel_shader_);
    Shader::bind(pSVar4,__fd,__addr,in_ECX);
    glGenVertexArrays(1,&this->drawing_vertex_array_);
    error_2 = glGetError();
    if (error_2 != 0) {
      switch(error_2) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,error_2);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x80);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x80,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glGenBuffers(1,&this->drawing_array_buffer_);
    error_3 = glGetError();
    if (error_3 != 0) {
      switch(error_3) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,error_3);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x81);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x81,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glBindVertexArray(this->drawing_vertex_array_);
    position_attribute = glGetError();
    if (position_attribute != 0) {
      switch(position_attribute) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,position_attribute);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x83,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glBindBuffer(0x8892,this->drawing_array_buffer_);
    local_40 = glGetError();
    if (local_40 != 0) {
      switch(local_40) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,local_40);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x84);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x84,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar4 = std::
             unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ::operator->(&this->pixel_shader_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"position",&local_69);
    GVar2 = Shader::get_attrib_location(pSVar4,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    local_44 = GVar2;
    pSVar4 = std::
             unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ::operator->(&this->pixel_shader_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error_4,"texCoord",(allocator<char> *)((long)&error_5 + 3));
    GVar2 = Shader::get_attrib_location(pSVar4,(string *)&error_4);
    std::__cxx11::string::~string((string *)&error_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&error_5 + 3));
    local_80 = GVar2;
    glEnableVertexAttribArray(local_44);
    vertex_stride = glGetError();
    if (vertex_stride != 0) {
      switch(vertex_stride) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,vertex_stride);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x89);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x89,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glEnableVertexAttribArray(local_80);
    error_6 = glGetError();
    if (error_6 != 0) {
      switch(error_6) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,error_6);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8a);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8a,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    error_7 = 0x10;
    glVertexAttribPointer(local_44,2,0x1406,0,0x10,0);
    texIDUniform = glGetError();
    if (texIDUniform != 0) {
      switch(texIDUniform) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,texIDUniform);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8d,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    glVertexAttribPointer(local_80,2,0x1406,0,0x10,8);
    local_b8 = glGetError();
    if (local_b8 != 0) {
      switch(local_b8) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,local_b8);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8e);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x8e,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar4 = std::
             unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ::operator->(&this->pixel_shader_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&error_8,"texID",&local_e1);
    GVar2 = Shader::get_uniform_location(pSVar4,(string *)&error_8);
    std::__cxx11::string::~string((string *)&error_8);
    std::allocator<char>::~allocator(&local_e1);
    local_bc = GVar2;
    glUniform1i(GVar2,this->texture_unit_ - 0x84c0);
    local_e8 = glGetError();
    if (local_e8 != 0) {
      switch(local_e8) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,local_e8);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x91);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0x91,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    pSVar4 = std::
             unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
             ::operator->(&this->pixel_shader_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"threshold",&local_109);
    name = &local_108;
    in_ECX = Shader::get_uniform_location(pSVar4,name);
    in_ESI = (int)name;
    this->threshold_uniform_ = in_ECX;
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  if ((this->set_aspect_ratio_ != vertex_shader._4_4_) ||
     (NAN(this->set_aspect_ratio_) || NAN(vertex_shader._4_4_))) {
    this->set_aspect_ratio_ = vertex_shader._4_4_;
    buffer[0] = 0.0;
    buffer[1] = 0.0;
    buffer[4] = 0.0;
    buffer[5] = (float)this->height_ / (float)this->expanded_height_;
    buffer[8] = (float)this->width_ / (float)this->expanded_width_;
    buffer[9] = 0.0;
    buffer[6] = ((float)this->width_ / (float)this->height_) / vertex_shader._4_4_;
    aspect_ratio_ratio = -buffer[6];
    internal_aspect_ratio = -1.0;
    buffer[2] = -buffer[6];
    buffer[3] = 1.0;
    buffer[7] = -1.0;
    buffer[0xb] = 1.0;
    buffer[10] = buffer[6];
    buffer[0xc] = buffer[8];
    buffer[0xd] = buffer[5];
    glBindBuffer(0x8892,this->drawing_array_buffer_);
    uVar3 = glGetError();
    if (uVar3 != 0) {
      switch(uVar3) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,uVar3);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xae);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xae,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
    in_ESI = 0x40;
    in_ECX = 0x88e4;
    glBufferData(0x8892,0x40,&aspect_ratio_ratio);
    uVar3 = glGetError();
    if (uVar3 != 0) {
      switch(uVar3) {
      case 0x500:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
        break;
      case 0x501:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
        break;
      case 0x502:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::operator<<(poVar5,uVar3);
        break;
      case 0x505:
        std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
        break;
      case 0x506:
        std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
      }
      poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaf);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                    ,0xaf,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
    }
  }
  pSVar4 = std::
           unique_ptr<Outputs::Display::OpenGL::Shader,_std::default_delete<Outputs::Display::OpenGL::Shader>_>
           ::operator->(&this->pixel_shader_);
  Shader::bind(pSVar4,in_ESI,__addr_00,in_ECX);
  glUniform1f(this->threshold_uniform_);
  uVar3 = glGetError();
  if (uVar3 != 0) {
    switch(uVar3) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar5,uVar3);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb3);
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb3,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  glBindVertexArray(this->drawing_vertex_array_);
  uVar3 = glGetError();
  if (uVar3 != 0) {
    switch(uVar3) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar5,uVar3);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb5);
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb5,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  glDrawArrays(5,0,4);
  uVar3 = glGetError();
  if (uVar3 != 0) {
    switch(uVar3) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar5,uVar3);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar5 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb6);
    poVar5 = std::operator<<(poVar5," in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/TextureTarget.cpp"
                  ,0xb6,"void Outputs::Display::OpenGL::TextureTarget::draw(float, float) const");
  }
  return;
}

Assistant:

void TextureTarget::draw(float aspect_ratio, float colour_threshold) const {
	if(!pixel_shader_) {
		const char *vertex_shader =
			"#version 150\n"

			"in vec2 texCoord;"
			"in vec2 position;"

			"out vec2 texCoordVarying;"

			"void main(void)"
			"{"
				"texCoordVarying = texCoord;"
				"gl_Position = vec4(position, 0.0, 1.0);"
			"}";
		const char *fragment_shader =
			"#version 150\n"

			"in vec2 texCoordVarying;"

			"uniform sampler2D texID;"
			"uniform float threshold;"

			"out vec4 fragColour;"

			"void main(void)"
			"{"
				"fragColour = clamp(texture(texID, texCoordVarying), threshold, 1.0);"
			"}";
		pixel_shader_ = std::make_unique<Shader>(vertex_shader, fragment_shader);
		pixel_shader_->bind();

		test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
		test_gl(glGenBuffers, 1, &drawing_array_buffer_);

		test_gl(glBindVertexArray, drawing_vertex_array_);
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

		const GLint position_attribute	= pixel_shader_->get_attrib_location("position");
		const GLint tex_coord_attribute	= pixel_shader_->get_attrib_location("texCoord");

		test_gl(glEnableVertexAttribArray, GLuint(position_attribute));
		test_gl(glEnableVertexAttribArray, GLuint(tex_coord_attribute));

		const GLsizei vertex_stride = 4 * sizeof(GLfloat);
		test_gl(glVertexAttribPointer, GLuint(position_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)0);
		test_gl(glVertexAttribPointer, GLuint(tex_coord_attribute),	2, GL_FLOAT,	GL_FALSE,	vertex_stride,	(void *)(2 * sizeof(GLfloat)));

		const GLint texIDUniform = pixel_shader_->get_uniform_location("texID");
		test_gl(glUniform1i, texIDUniform, GLint(texture_unit_ - GL_TEXTURE0));

		threshold_uniform_ = pixel_shader_->get_uniform_location("threshold");
	}

	if(set_aspect_ratio_ != aspect_ratio) {
		set_aspect_ratio_ = aspect_ratio;
		float buffer[4*4];

		// establish texture coordinates
		buffer[2] = 0.0f;
		buffer[3] = 0.0f;
		buffer[6] = 0.0f;
		buffer[7] = float(height_) / float(expanded_height_);
		buffer[10] = float(width_) / float(expanded_width_);
		buffer[11] = 0.0f;
		buffer[14] = buffer[10];
		buffer[15] = buffer[7];

		// determine positions; rule is to keep the same height and centre
		float internal_aspect_ratio = float(width_) / float(height_);
		float aspect_ratio_ratio = internal_aspect_ratio / aspect_ratio;

		buffer[0] = -aspect_ratio_ratio;	buffer[1] = -1.0f;
		buffer[4] = -aspect_ratio_ratio;	buffer[5] = 1.0f;
		buffer[8] = aspect_ratio_ratio;		buffer[9] = -1.0f;
		buffer[12] = aspect_ratio_ratio;	buffer[13] = 1.0f;

		// upload buffer
		test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
		test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
	}

	pixel_shader_->bind();
	test_gl(glUniform1f, threshold_uniform_, colour_threshold);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glDrawArrays, GL_TRIANGLE_STRIP, 0, 4);
}